

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

CategoricalCrossEntropyLossLayer * __thiscall
CoreML::Specification::LossLayer::mutable_categoricalcrossentropylosslayer(LossLayer *this)

{
  CategoricalCrossEntropyLossLayer *this_00;
  
  if (this->_oneof_case_[0] == 10) {
    this_00 = (this->LossLayerType_).categoricalcrossentropylosslayer_;
  }
  else {
    clear_LossLayerType(this);
    this->_oneof_case_[0] = 10;
    this_00 = (CategoricalCrossEntropyLossLayer *)operator_new(0x28);
    CategoricalCrossEntropyLossLayer::CategoricalCrossEntropyLossLayer(this_00);
    (this->LossLayerType_).categoricalcrossentropylosslayer_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::CategoricalCrossEntropyLossLayer* LossLayer::mutable_categoricalcrossentropylosslayer() {
  if (!has_categoricalcrossentropylosslayer()) {
    clear_LossLayerType();
    set_has_categoricalcrossentropylosslayer();
    LossLayerType_.categoricalcrossentropylosslayer_ = new ::CoreML::Specification::CategoricalCrossEntropyLossLayer;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.LossLayer.categoricalCrossEntropyLossLayer)
  return LossLayerType_.categoricalcrossentropylosslayer_;
}